

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QTextLayout::FormatRange>::end(QList<QTextLayout::FormatRange> *this)

{
  FormatRange *n;
  QArrayDataPointer<QTextLayout::FormatRange> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QTextLayout::FormatRange> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTextLayout::FormatRange> *)0x5e6629);
  QArrayDataPointer<QTextLayout::FormatRange>::operator->(in_RDI);
  n = QArrayDataPointer<QTextLayout::FormatRange>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }